

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall
Json::OurReader::parse(OurReader *this,char *beginDoc,char *endDoc,Value *root,bool collectComments)

{
  bool bVar1;
  ulong uVar2;
  undefined8 in_RCX;
  _Map_pointer in_RDX;
  _Elt_pointer in_RSI;
  deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_> *in_RDI;
  byte in_R8B;
  Token token;
  bool successful;
  CommentPlacement in_stack_00000124;
  String *in_stack_00000128;
  Value *in_stack_00000130;
  OurReader *in_stack_00000188;
  Token *in_stack_fffffffffffffef8;
  OurReader *in_stack_ffffffffffffff00;
  allocator *paVar3;
  allocator local_d1;
  string local_d0 [32];
  string local_b0 [8];
  Location in_stack_ffffffffffffff58;
  Token *in_stack_ffffffffffffff60;
  String *in_stack_ffffffffffffff68;
  OurReader *in_stack_ffffffffffffff70;
  allocator local_79;
  string local_78 [32];
  int local_58;
  _Elt_pointer local_50;
  _Map_pointer local_48;
  byte local_39;
  undefined8 local_38;
  byte local_29;
  undefined8 local_28;
  _Map_pointer local_20;
  _Elt_pointer local_18;
  bool local_1;
  
  local_29 = in_R8B & 1;
  if (((ulong)in_RDI[3].
              super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
              ._M_impl.super__Deque_impl_data._M_start._M_first & 1) == 0) {
    local_29 = 0;
  }
  in_RDI[2].
  super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>._M_impl
  .super__Deque_impl_data._M_start._M_last = in_RSI;
  in_RDI[2].
  super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>._M_impl
  .super__Deque_impl_data._M_start._M_node = in_RDX;
  *(byte *)&in_RDI[3].
            super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node = local_29;
  in_RDI[2].
  super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>._M_impl
  .super__Deque_impl_data._M_finish._M_cur =
       in_RDI[2].
       super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>.
       _M_impl.super__Deque_impl_data._M_start._M_last;
  in_RDI[2].
  super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>._M_impl
  .super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  in_RDI[2].
  super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>._M_impl
  .super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::__cxx11::string::clear();
  std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::clear(in_RDI)
  ;
  while (bVar1 = std::
                 stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::
                 empty((stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>
                        *)0x1eb02b), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::pop
              ((stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_> *)
               0x1eb03d);
  }
  local_38 = local_28;
  std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::push
            (&in_stack_ffffffffffffff00->nodes_,(value_type *)in_stack_fffffffffffffef8);
  local_39 = readValue(in_stack_00000188);
  std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::pop
            ((stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_> *)
             0x1eb07e);
  skipCommentTokens(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  if ((((ulong)in_RDI[3].
               super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
               ._M_impl.super__Deque_impl_data._M_start._M_first & 0x10000000000) == 0) ||
     (local_58 == 0)) {
    if ((((ulong)in_RDI[3].
                 super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node & 1) != 0) &&
       (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
      std::__cxx11::string::string
                (local_b0,(string *)
                          &in_RDI[2].
                           super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node);
      Value::setComment(in_stack_00000130,in_stack_00000128,in_stack_00000124);
      std::__cxx11::string::~string(local_b0);
    }
    if (((((ulong)in_RDI[3].
                  super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_first & 0x100) == 0) ||
        (bVar1 = Value::isArray((Value *)0x1eb213), bVar1)) ||
       (bVar1 = Value::isObject((Value *)0x1eb228), bVar1)) {
      local_1 = (bool)(local_39 & 1);
    }
    else {
      local_58 = 0x10;
      local_50 = local_18;
      local_48 = local_20;
      paVar3 = &local_d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_d0,"A valid JSON document must be either an array or an object value.",paVar3
                );
      addError(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
      std::__cxx11::string::~string(local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      local_1 = false;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Extra non-whitespace after JSON value.",&local_79);
    addError(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool OurReader::parse(const char* beginDoc,
                      const char* endDoc,
                      Value& root,
                      bool collectComments) {
  if (!features_.allowComments_) {
    collectComments = false;
  }

  begin_ = beginDoc;
  end_ = endDoc;
  collectComments_ = collectComments;
  current_ = begin_;
  lastValueEnd_ = nullptr;
  lastValue_ = nullptr;
  commentsBefore_.clear();
  errors_.clear();
  while (!nodes_.empty())
    nodes_.pop();
  nodes_.push(&root);

  bool successful = readValue();
  nodes_.pop();
  Token token;
  skipCommentTokens(token);
  if (features_.failIfExtra_ && (token.type_ != tokenEndOfStream)) {
    addError("Extra non-whitespace after JSON value.", token);
    return false;
  }
  if (collectComments_ && !commentsBefore_.empty())
    root.setComment(commentsBefore_, commentAfter);
  if (features_.strictRoot_) {
    if (!root.isArray() && !root.isObject()) {
      // Set error location to start of doc, ideally should be first token found
      // in doc
      token.type_ = tokenError;
      token.start_ = beginDoc;
      token.end_ = endDoc;
      addError(
          "A valid JSON document must be either an array or an object value.",
          token);
      return false;
    }
  }
  return successful;
}